

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::Message::ShortDebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  size_type sVar1;
  StringOutputStream output_stream;
  StringOutputStream local_b0;
  Printer local_a0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&local_a0);
  local_a0.single_line_mode_ = true;
  local_a0.expand_any_ = true;
  local_a0.insert_silent_marker_ = (bool)(internal::enable_debug_text_format_marker & 1);
  __return_storage_ptr__->_M_string_length = 0;
  *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_b0,__return_storage_ptr__);
  TextFormat::Printer::Print(&local_a0,this,&local_b0.super_ZeroCopyOutputStream);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if ((sVar1 != 0) && ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == ' ')) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1 + -1);
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::~_Rb_tree(&local_a0.custom_message_printers_._M_t);
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::~_Rb_tree(&local_a0.custom_printers_._M_t);
  if ((__uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )local_a0.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )0x0) {
    (*(*(_func_int ***)
        local_a0.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::ShortDebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);
  printer.SetInsertSilentMarker(internal::enable_debug_text_format_marker.load(
      std::memory_order_relaxed));

  printer.PrintToString(*this, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (!debug_string.empty() && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}